

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void * tlb_vaddr_to_host_ppc64
                 (CPUArchState_conflict23 *env,abi_ptr addr,MMUAccessType access_type,int mmu_idx)

{
  _Bool _Var1;
  char cVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong index;
  long lVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  CPUPPCState_conflict2 *__mptr;
  
  if (MMU_INST_FETCH < access_type) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
               ,0x4f9,(char *)0x0);
  }
  lVar5 = (long)mmu_idx * 0x10;
  index = *(ulong *)((long)env + lVar5 + -0xb0) >> 6 & addr >> 0xc;
  lVar8 = index * 0x40 + *(long *)((long)env + lVar5 + -0xa8);
  uVar7 = (ulong)access_type;
  uVar4 = *(ulong *)(lVar8 + uVar7 * 8);
  if ((uVar4 & 0xfffffffffffff800) != (addr & 0xfffffffffffff000)) {
    _Var1 = victim_tlb_hit(env,(long)mmu_idx,index,uVar7 * 8,addr & 0xfffffffffffff000);
    if (_Var1) {
      puVar3 = (ulong *)(uVar7 * 8 + lVar8);
    }
    else {
      cVar2 = (**(code **)(env[-1].spr_cb[0x3c6].uea_write + 0x48))
                        (&env[-1].spr_cb[0x1bf].oea_write,addr,0,access_type,mmu_idx,1,0);
      if (cVar2 == '\0') {
        return (void *)0x0;
      }
      lVar8 = (*(ulong *)((long)env + lVar5 + -0xb0) >> 6 & addr >> 0xc) * 0x40 +
              *(long *)((long)env + lVar5 + -0xa8);
      puVar3 = (ulong *)(uVar7 * 8 + lVar8);
    }
    uVar4 = *puVar3;
  }
  if ((uVar4 & 0xfff) == 0) {
    pvVar6 = (void *)(addr + *(long *)(lVar8 + 0x20));
  }
  else {
    pvVar6 = (void *)0x0;
  }
  return pvVar6;
}

Assistant:

void *tlb_vaddr_to_host(CPUArchState *env, abi_ptr addr,
                        MMUAccessType access_type, int mmu_idx)
{
    struct uc_struct *uc = env->uc;
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr, page;
    size_t elt_ofs = 0;

    switch (access_type) {
    case MMU_DATA_LOAD:
        elt_ofs = offsetof(CPUTLBEntry, addr_read);
        break;
    case MMU_DATA_STORE:
        elt_ofs = offsetof(CPUTLBEntry, addr_write);
        break;
    case MMU_INST_FETCH:
        elt_ofs = offsetof(CPUTLBEntry, addr_code);
        break;
    default:
        g_assert_not_reached();
    }

    page = addr & TARGET_PAGE_MASK;
    tlb_addr = tlb_read_ofs(entry, elt_ofs);

    if (!tlb_hit_page(uc, tlb_addr, page)) {
        uintptr_t index = tlb_index(env, mmu_idx, addr);

        if (!victim_tlb_hit(env, mmu_idx, index, elt_ofs, page)) {
            CPUState *cs = env_cpu(env);
            CPUClass *cc = CPU_GET_CLASS(cs);

            if (!cc->tlb_fill(cs, addr, 0, access_type, mmu_idx, true, 0)) {
                /* Non-faulting page table read failed.  */
                return NULL;
            }

            /* TLB resize via tlb_fill may have moved the entry.  */
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_read_ofs(entry, elt_ofs);
    }

    if (tlb_addr & ~TARGET_PAGE_MASK) {
        /* IO access */
        return NULL;
    }

    return (void *)((uintptr_t)addr + entry->addend);
}